

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::clear
          (BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *this)

{
  long *plVar1;
  void *ptr;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar2 = *(long *)(this + 0x28);
  lVar3 = *(long *)(lVar2 + 0x200);
  if (*(long *)(lVar2 + 0x208) != lVar3) {
    uVar4 = 0;
    do {
      plVar1 = *(long **)(lVar3 + uVar4 * 8);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x28))();
        lVar2 = *(long *)(this + 0x28);
      }
      uVar4 = uVar4 + 1;
      lVar3 = *(long *)(lVar2 + 0x200);
    } while (uVar4 < (ulong)(*(long *)(lVar2 + 0x208) - lVar3 >> 3));
  }
  lVar3 = *(long *)(this + 0x10);
  lVar2 = *(long *)(this + 0x18);
  if (lVar2 != lVar3) {
    uVar4 = 0;
    do {
      plVar1 = *(long **)(lVar3 + uVar4 * 8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)(lVar3 + uVar4 * 8) = 0;
        (**(code **)(*plVar1 + 8))();
        lVar3 = *(long *)(this + 0x10);
        lVar2 = *(long *)(this + 0x18);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(lVar2 - lVar3 >> 3));
  }
  lVar3 = *(long *)(this + 0x50);
  ptr = *(void **)(this + 0x58);
  if (ptr != (void *)0x0) {
    if ((ulong)(lVar3 << 6) < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,lVar3 << 6,(bool)this[0x40]);
    }
  }
  if (lVar3 != 0) {
    (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),lVar3 * -0x40,1);
  }
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::clear()
    {
      for (size_t i=0; i<bvh->objects.size(); i++) 
        if (bvh->objects[i]) bvh->objects[i]->clear();

      for (size_t i=0; i<builders.size(); i++) 
        if (builders[i]) builders[i].reset();

      refs.clear();
    }